

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O1

aom_codec_cx_pkt_t * aom_codec_get_cx_data(aom_codec_ctx_t *ctx,aom_codec_iter_t *iter)

{
  size_t *psVar1;
  aom_codec_iface_t *paVar2;
  aom_codec_priv_t *paVar3;
  void *pvVar4;
  void *__src;
  size_t __n;
  aom_codec_cx_pkt_t *__src_00;
  aom_codec_cx_pkt_t *__dest;
  ulong uVar5;
  
  if (ctx != (aom_codec_ctx_t *)0x0) {
    if (iter == (aom_codec_iter_t *)0x0) {
      ctx->err = AOM_CODEC_INVALID_PARAM;
    }
    else {
      paVar2 = ctx->iface;
      if ((paVar2 == (aom_codec_iface_t *)0x0) ||
         ((aom_codec_alg_priv_t_conflict *)ctx->priv == (aom_codec_alg_priv_t_conflict *)0x0)) {
        ctx->err = AOM_CODEC_ERROR;
      }
      else {
        if ((paVar2->caps & 2) != 0) {
          __src_00 = (*(paVar2->enc).get_cx_data)((aom_codec_alg_priv_t_conflict *)ctx->priv,iter);
          goto LAB_00167305;
        }
        ctx->err = AOM_CODEC_INCAPABLE;
      }
    }
  }
  __src_00 = (aom_codec_cx_pkt_t *)0x0;
LAB_00167305:
  if (__src_00 == (aom_codec_cx_pkt_t *)0x0) {
    __dest = (aom_codec_cx_pkt_t *)0x0;
  }
  else {
    __dest = __src_00;
    if (__src_00->kind == AOM_CODEC_CX_FRAME_PKT) {
      paVar3 = ctx->priv;
      pvVar4 = (paVar3->enc).cx_data_dst_buf.buf;
      if ((pvVar4 != (void *)0x0) && (__src = (__src_00->data).frame.buf, __src != pvVar4)) {
        __n = (__src_00->data).frame.sz;
        uVar5 = (ulong)(paVar3->enc).cx_data_pad_before;
        if ((paVar3->enc).cx_data_pad_after + __n + uVar5 <= (paVar3->enc).cx_data_dst_buf.sz) {
          __dest = &(paVar3->enc).cx_data_pkt;
          memcpy((void *)(uVar5 + (long)pvVar4),__src,__n);
          memcpy(__dest,__src_00,0xa8);
          (paVar3->enc).cx_data_pkt.data.frame.buf = pvVar4;
          psVar1 = &(paVar3->enc).cx_data_pkt.data.frame.sz;
          *psVar1 = *psVar1 + (ulong)((paVar3->enc).cx_data_pad_after +
                                     (paVar3->enc).cx_data_pad_before);
        }
      }
      if (pvVar4 == (__dest->data).frame.buf) {
        (paVar3->enc).cx_data_dst_buf.buf = (void *)((long)pvVar4 + (__dest->data).frame.sz);
        psVar1 = &(paVar3->enc).cx_data_dst_buf.sz;
        *psVar1 = *psVar1 - (__dest->data).frame.sz;
      }
    }
  }
  return __dest;
}

Assistant:

const aom_codec_cx_pkt_t *aom_codec_get_cx_data(aom_codec_ctx_t *ctx,
                                                aom_codec_iter_t *iter) {
  const aom_codec_cx_pkt_t *pkt = NULL;

  if (ctx) {
    if (!iter)
      ctx->err = AOM_CODEC_INVALID_PARAM;
    else if (!ctx->iface || !ctx->priv)
      ctx->err = AOM_CODEC_ERROR;
    else if (!(ctx->iface->caps & AOM_CODEC_CAP_ENCODER))
      ctx->err = AOM_CODEC_INCAPABLE;
    else
      pkt = ctx->iface->enc.get_cx_data(get_alg_priv(ctx), iter);
  }

  if (pkt && pkt->kind == AOM_CODEC_CX_FRAME_PKT) {
    // If the application has specified a destination area for the
    // compressed data, and the codec has not placed the data there,
    // and it fits, copy it.
    aom_codec_priv_t *const priv = ctx->priv;
    char *const dst_buf = (char *)priv->enc.cx_data_dst_buf.buf;

    if (dst_buf && pkt->data.raw.buf != dst_buf &&
        pkt->data.raw.sz + priv->enc.cx_data_pad_before +
                priv->enc.cx_data_pad_after <=
            priv->enc.cx_data_dst_buf.sz) {
      aom_codec_cx_pkt_t *modified_pkt = &priv->enc.cx_data_pkt;

      memcpy(dst_buf + priv->enc.cx_data_pad_before, pkt->data.raw.buf,
             pkt->data.raw.sz);
      *modified_pkt = *pkt;
      modified_pkt->data.raw.buf = dst_buf;
      modified_pkt->data.raw.sz +=
          priv->enc.cx_data_pad_before + priv->enc.cx_data_pad_after;
      pkt = modified_pkt;
    }

    if (dst_buf == pkt->data.raw.buf) {
      priv->enc.cx_data_dst_buf.buf = dst_buf + pkt->data.raw.sz;
      priv->enc.cx_data_dst_buf.sz -= pkt->data.raw.sz;
    }
  }

  return pkt;
}